

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

bool __thiscall
OpenMD::ForceMatrixDecomposition::excludeAtomPair
          (ForceMatrixDecomposition *this,int atom1,int atom2)

{
  pointer pvVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  
  pvVar1 = (this->super_ForceDecomposition).excludesForAtom.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar2 = *(pointer *)
            ((long)&pvVar1[atom1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
  piVar3 = pvVar1[atom1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    piVar4 = piVar3;
    if (piVar4 == piVar2) break;
    piVar3 = piVar4 + 1;
  } while (*piVar4 != atom2);
  return piVar4 != piVar2;
}

Assistant:

bool ForceMatrixDecomposition::excludeAtomPair(int atom1, int atom2) {
    // excludesForAtom was constructed to use row/column indices in the MPI
    // version, and to use local IDs in the non-MPI version:

    for (vector<int>::iterator i = excludesForAtom[atom1].begin();
         i != excludesForAtom[atom1].end(); ++i) {
      if ((*i) == atom2) return true;
    }

    return false;
  }